

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferOperations.cpp
# Opt level: O2

void __thiscall glcts::TextureBufferOperations::deinitFirstPhase(TextureBufferOperations *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar2 + 0x40))(0x8892,0);
  (**(code **)(lVar2 + 0x48))(0x90d2,0,0);
  (**(code **)(lVar2 + 0x1680))(0);
  if (this->m_po_cs_id != 0) {
    (**(code **)(lVar2 + 0x448))();
    this->m_po_cs_id = 0;
  }
  if (this->m_cs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_cs_id = 0;
  }
  if (this->m_ssbo_bo_id != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_ssbo_bo_id);
    this->m_ssbo_bo_id = 0;
  }
  return;
}

Assistant:

void TextureBufferOperations::deinitFirstPhase(void)
{
	/* Get GLES entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset GLES state */
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);
	gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, 0);
	gl.useProgram(0);

	/* Delete GLES objects */
	if (0 != m_po_cs_id)
	{
		gl.deleteProgram(m_po_cs_id);
		m_po_cs_id = 0;
	}

	if (0 != m_cs_id)
	{
		gl.deleteShader(m_cs_id);
		m_cs_id = 0;
	}

	if (0 != m_ssbo_bo_id)
	{
		gl.deleteBuffers(1, &m_ssbo_bo_id);
		m_ssbo_bo_id = 0;
	}
}